

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Abc_NtkDfsReverseOne_rec(Abc_Obj_t *pObj,Vec_Int_t *vTfo,int nLevelMax,int nFanoutMax)

{
  int iVar1;
  uint Entry;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pFanout;
  int nFanoutMax_local;
  int nLevelMax_local;
  Vec_Int_t *vTfo_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjIsCo(pObj);
    if ((iVar1 == 0) && (iVar1 = Abc_ObjLevel(pObj), iVar1 <= nLevelMax)) {
      iVar1 = Abc_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode( pObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x572,"void Abc_NtkDfsReverseOne_rec(Abc_Obj_t *, Vec_Int_t *, int, int)");
      }
      iVar1 = Abc_ObjFanoutNum(pObj);
      if (iVar1 <= nFanoutMax) {
        for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_2c < iVar1; local_2c = local_2c + 1
            ) {
          pAVar2 = Abc_ObjFanout(pObj,local_2c);
          iVar1 = Abc_ObjIsCo(pAVar2);
          if ((iVar1 != 0) || (iVar1 = Abc_ObjLevel(pAVar2), nLevelMax < iVar1)) break;
        }
        iVar1 = Abc_ObjFanoutNum(pObj);
        if (local_2c == iVar1) {
          for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_2c < iVar1;
              local_2c = local_2c + 1) {
            pAVar2 = Abc_ObjFanout(pObj,local_2c);
            Abc_NtkDfsReverseOne_rec(pAVar2,vTfo,nLevelMax,nFanoutMax);
          }
        }
      }
      Entry = Abc_ObjId(pObj);
      Vec_IntPush(vTfo,Entry);
      (pObj->field_6).iTemp = 0;
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsReverseOne_rec( Abc_Obj_t * pObj, Vec_Int_t * vTfo, int nLevelMax, int nFanoutMax )
{
    Abc_Obj_t * pFanout; int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCo(pObj) || Abc_ObjLevel(pObj) > nLevelMax )
        return;
    assert( Abc_ObjIsNode( pObj ) );
    if ( Abc_ObjFanoutNum(pObj) <= nFanoutMax )
    {
        Abc_ObjForEachFanout( pObj, pFanout, i )
            if ( Abc_ObjIsCo(pFanout) || Abc_ObjLevel(pFanout) > nLevelMax )
                break;
        if ( i == Abc_ObjFanoutNum(pObj) )
            Abc_ObjForEachFanout( pObj, pFanout, i )
                Abc_NtkDfsReverseOne_rec( pFanout, vTfo, nLevelMax, nFanoutMax );
    }
    Vec_IntPush( vTfo, Abc_ObjId(pObj) );
    pObj->iTemp = 0;
}